

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::blit(Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,
                  ssize_t sy)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  uint64_t b;
  uint64_t g;
  uint64_t r;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  ulong local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  Image *local_78;
  long local_70;
  long local_68;
  long local_60;
  Image *local_58;
  uint local_50 [2];
  uint local_48 [2];
  uint local_40 [2];
  uint local_38 [2];
  
  lVar1 = source->width;
  lVar2 = source->height;
  if (w < 0) {
    w = lVar1;
  }
  if (h < 0) {
    h = lVar2;
  }
  uVar5 = sx >> 0x3f & sx;
  local_60 = x - uVar5;
  lVar8 = 0;
  if (sx < 1) {
    sx = lVar8;
  }
  uVar6 = sy >> 0x3f & sy;
  local_68 = y - uVar6;
  if (sy < 1) {
    sy = lVar8;
  }
  lVar3 = 0;
  if (0 < local_60) {
    lVar3 = local_60;
  }
  if (-1 < local_60) {
    local_60 = lVar8;
  }
  uVar5 = uVar5 + w + local_60;
  local_60 = sx - local_60;
  local_70 = 0;
  if (0 < local_68) {
    local_70 = local_68;
  }
  if (-1 < local_68) {
    local_68 = lVar8;
  }
  uVar7 = uVar6 + h + local_68;
  local_68 = sy - local_68;
  uVar6 = lVar1 - local_60;
  if ((long)(uVar5 + local_60) <= lVar1) {
    uVar6 = uVar5;
  }
  uVar5 = lVar2 - local_68;
  if ((long)(uVar7 + local_68) <= lVar2) {
    uVar5 = uVar7;
  }
  uVar7 = this->width - lVar3;
  if ((long)(uVar6 + lVar3) <= this->width) {
    uVar7 = uVar6;
  }
  local_80 = this->height - local_70;
  if ((long)(uVar5 + local_70) <= this->height) {
    local_80 = uVar5;
  }
  bVar9 = -1 < (long)(uVar7 | local_80);
  if ((bVar9) && (bVar10 = -1 < (long)local_80, 0 < (long)local_80)) {
    local_a0 = 0;
    local_78 = this;
    local_58 = source;
    do {
      if (0 < (long)uVar7 && bVar10) {
        lVar1 = local_a0 + local_68;
        lVar2 = local_a0 + local_70;
        lVar8 = 0;
        do {
          read_pixel(local_58,local_60 + lVar8,lVar1,&local_88,&local_90,&local_98,&local_a8);
          if (local_a8 != 0) {
            if (local_a8 != 0xff) {
              read_pixel(local_78,lVar3 + lVar8,lVar2,(uint64_t *)local_38,(uint64_t *)local_40,
                         (uint64_t *)local_48,(uint64_t *)local_50);
              lVar4 = 0xff - local_a8;
              local_88 = ((ulong)local_38[0] * lVar4 + (local_88 & 0xffffffff) * local_a8) / 0xff;
              local_90 = ((ulong)local_40[0] * lVar4 + (local_90 & 0xffffffff) * local_a8) / 0xff;
              local_98 = ((ulong)local_48[0] * lVar4 + (local_98 & 0xffffffff) * local_a8) / 0xff;
              local_a8 = ((ulong)local_50[0] * lVar4 + (local_a8 & 0xffffffff) * local_a8) / 0xff;
            }
            write_pixel(local_78,lVar3 + lVar8,lVar2,local_88,local_90,local_98,local_a8);
          }
          lVar8 = lVar8 + 1;
        } while (bVar9 && lVar8 < (long)uVar7);
      }
      local_a0 = local_a0 + 1;
    } while (bVar9 && local_a0 < (long)local_80);
  }
  return;
}

Assistant:

void Image::blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (ssize_t yy = 0; yy < h; yy++) {
    for (ssize_t xx = 0; xx < w; xx++) {
      uint64_t r, g, b, a;
      source.read_pixel(sx + xx, sy + yy, &r, &g, &b, &a);
      if (a == 0) {
        continue;
      }
      if (a != 0xFF) {
        uint64_t sr, sg, sb, sa;
        this->read_pixel(x + xx, y + yy, &sr, &sg, &sb, &sa);
        r = (a * (uint32_t)r + (0xFF - a) * (uint32_t)sr) / 0xFF;
        g = (a * (uint32_t)g + (0xFF - a) * (uint32_t)sg) / 0xFF;
        b = (a * (uint32_t)b + (0xFF - a) * (uint32_t)sb) / 0xFF;
        a = (a * (uint32_t)a + (0xFF - a) * (uint32_t)sa) / 0xFF;
      }
      this->write_pixel(x + xx, y + yy, r, g, b, a);
    }
  }
}